

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O1

void SetWallScroller(int id,int sidechoice,double dx,double dy,EScrollPos Where)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  DThinker *pDVar4;
  DScroller *this;
  FThinkerCollection *pFVar5;
  EScrollPos scrollpos;
  int iVar6;
  uint uVar7;
  TArray<FThinkerCollection,_FThinkerCollection> Collection;
  TThinkerIterator<DScroller> iterator;
  TArray<FThinkerCollection,_FThinkerCollection> local_68;
  PClass *local_50;
  FThinkerIterator local_48;
  
  scrollpos = Where & scw_all;
  if (scrollpos != 0) {
    local_50 = (PClass *)dx;
    if ((((dx != 0.0) || (NAN(dx))) || (dy != 0.0)) || (NAN(dy))) {
      local_68.Array = (FThinkerCollection *)0x0;
      local_68.Most = 0;
      local_68.Count = 0;
      FThinkerIterator::FThinkerIterator(&local_48,DScroller::RegistrationInfo.MyClass,0x20);
      while (pDVar4 = FThinkerIterator::Next(&local_48,false), uVar7 = local_68.Count,
            pDVar4 != (DThinker *)0x0) {
        iVar6 = *(int *)&pDVar4[1].super_DObject.GCNext;
        if (iVar6 != -1 && *(int *)&pDVar4[1].super_DObject._vptr_DObject == 0) {
          bVar1 = FTagManager::LineHasID(&tagManager,sides[iVar6].linedef,id);
          if (((bVar1) &&
              (iVar6 == (int)((ulong)((long)(sides[iVar6].linedef)->sidedef[sidechoice] -
                                     (long)sides) >> 6) * -0x55555555)) &&
             (scrollpos == *(EScrollPos *)((long)&pDVar4[2].super_DObject._vptr_DObject + 4))) {
            pDVar4[1].super_DObject.Class = local_50;
            pDVar4[1].super_DObject.ObjNext = (DObject *)dy;
            TArray<FThinkerCollection,_FThinkerCollection>::Grow(&local_68,1);
            local_68.Array[local_68.Count].RefNum = iVar6;
            local_68.Array[local_68.Count].Obj = pDVar4;
            local_68.Count = local_68.Count + 1;
          }
        }
      }
      local_48.m_ParentType._4_4_ = tagManager.IDHashFirst[(ulong)(uint)id & 0xff];
      local_48.m_ParentType._0_4_ = id;
      while (uVar2 = FLineIdIterator::Next((FLineIdIterator *)&local_48), -1 < (int)uVar2) {
        if (lines[uVar2].sidedef[sidechoice] != (side_t *)0x0) {
          iVar6 = (int)((ulong)((long)lines[uVar2].sidedef[sidechoice] - (long)sides) >> 6) *
                  -0x55555555;
          uVar3 = 0;
          pFVar5 = local_68.Array;
          uVar2 = uVar3;
          if (uVar7 != 0) {
            do {
              uVar2 = uVar3;
              if (pFVar5->RefNum == iVar6) break;
              uVar3 = uVar3 + 1;
              pFVar5 = pFVar5 + 1;
              uVar2 = uVar7;
            } while (uVar7 != uVar3);
          }
          if (uVar2 == uVar7) {
            this = (DScroller *)
                   M_Malloc_Dbg(0x90,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                ,0x1f9);
            DScroller::DScroller(this,sc_side,(double)local_50,dy,-1,iVar6,0,scrollpos);
          }
        }
      }
      TArray<FThinkerCollection,_FThinkerCollection>::~TArray(&local_68);
    }
    else {
      FThinkerIterator::FThinkerIterator(&local_48,DScroller::RegistrationInfo.MyClass,0x20);
      pDVar4 = FThinkerIterator::Next(&local_48,false);
      if (pDVar4 != (DThinker *)0x0) {
        do {
          uVar7 = -(uint)(*(int *)&pDVar4[1].super_DObject._vptr_DObject != 0) |
                  *(uint *)&pDVar4[1].super_DObject.GCNext;
          if (-1 < (int)uVar7) {
            bVar1 = FTagManager::LineHasID(&tagManager,sides[uVar7].linedef,id);
            if (((bVar1) &&
                (uVar7 == (int)((ulong)((long)(sides[uVar7].linedef)->sidedef[sidechoice] -
                                       (long)sides) >> 6) * -0x55555555)) &&
               (scrollpos == *(EScrollPos *)((long)&pDVar4[2].super_DObject._vptr_DObject + 4))) {
              (*(pDVar4->super_DObject)._vptr_DObject[4])(pDVar4);
            }
          }
          pDVar4 = FThinkerIterator::Next(&local_48,false);
        } while (pDVar4 != (DThinker *)0x0);
      }
    }
  }
  return;
}

Assistant:

void SetWallScroller (int id, int sidechoice, double dx, double dy, EScrollPos Where)
{
	Where = Where & scw_all;
	if (Where == 0) return;

	if (dx == 0 && dy == 0)
	{
		// Special case: Remove the scroller, because the deltas are both 0.
		TThinkerIterator<DScroller> iterator (STAT_SCROLLER);
		DScroller *scroller;

		while ( (scroller = iterator.Next ()) )
		{
			int wallnum = scroller->GetWallNum ();

			if (wallnum >= 0 && tagManager.LineHasID(sides[wallnum].linedef, id) &&
				int(sides[wallnum].linedef->sidedef[sidechoice] - sides) == wallnum &&
				Where == scroller->GetScrollParts())
			{
				scroller->Destroy ();
			}
		}
	}
	else
	{
		// Find scrollers already attached to the matching walls, and change
		// their rates.
		TArray<FThinkerCollection> Collection;
		{
			TThinkerIterator<DScroller> iterator (STAT_SCROLLER);
			FThinkerCollection collect;

			while ( (collect.Obj = iterator.Next ()) )
			{
				if ((collect.RefNum = ((DScroller *)collect.Obj)->GetWallNum ()) != -1 &&
					tagManager.LineHasID(sides[collect.RefNum].linedef, id) &&
					int(sides[collect.RefNum].linedef->sidedef[sidechoice] - sides) == collect.RefNum &&
					Where == ((DScroller *)collect.Obj)->GetScrollParts())
				{
					((DScroller *)collect.Obj)->SetRate (dx, dy);
					Collection.Push (collect);
				}
			}
		}

		size_t numcollected = Collection.Size ();
		int linenum;

		// Now create scrollers for any walls that don't already have them.
		FLineIdIterator itr(id);
		while ((linenum = itr.Next()) >= 0)
		{
			if (lines[linenum].sidedef[sidechoice] != NULL)
			{
				int sidenum = int(lines[linenum].sidedef[sidechoice] - sides);
				unsigned int i;
				for (i = 0; i < numcollected; i++)
				{
					if (Collection[i].RefNum == sidenum)
						break;
				}
				if (i == numcollected)
				{
					new DScroller (EScroll::sc_side, dx, dy, -1, sidenum, 0, Where);
				}
			}
		}
	}
}